

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v10::detail::print(detail *this,FILE *f,string_view text)

{
  fwrite_fully(f,(size_t)text.data_,(FILE *)this);
  return;
}

Assistant:

FMT_FUNC void print(std::FILE* f, string_view text) {
#ifdef _WIN32
  int fd = _fileno(f);
  if (_isatty(fd)) {
    std::fflush(f);
    if (write_console(fd, text)) return;
  }
#endif
  fwrite_fully(text.data(), text.size(), f);
}